

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_iface.hpp
# Opt level: O2

void __thiscall Args::GroupIface::~GroupIface(GroupIface *this)

{
  (this->super_ArgIface)._vptr_ArgIface = (_func_int **)&PTR__GroupIface_00136c98;
  std::__cxx11::string::~string((string *)&this->m_name);
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::~vector(&this->m_children);
  return;
}

Assistant:

virtual ~GroupIface()
	{
	}